

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

ALLEGRO_CONFIG_SECTION * config_add_section(ALLEGRO_CONFIG *config,ALLEGRO_USTR *name)

{
  ALLEGRO_CONFIG_SECTION *pAVar1;
  ALLEGRO_CONFIG_SECTION *value;
  ALLEGRO_USTR *key;
  Aatree *pAVar2;
  
  pAVar1 = config->head;
  value = (ALLEGRO_CONFIG_SECTION *)_al_aa_search((Aatree *)config->tree,name,cmp_ustr);
  if (value == (ALLEGRO_CONFIG_SECTION *)0x0) {
    value = (ALLEGRO_CONFIG_SECTION *)
            al_calloc_with_context
                      (1,0x30,0x58,
                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
                       ,"config_add_section");
    key = al_ustr_dup(name);
    value->name = key;
    if (pAVar1 == (ALLEGRO_CONFIG_SECTION *)0x0) {
      config->head = value;
    }
    else {
      pAVar1 = config->last;
      pAVar1->next = value;
      value->prev = pAVar1;
    }
    config->last = value;
    pAVar2 = _al_aa_insert((Aatree *)config->tree,key,value,cmp_ustr);
    config->tree = (_AL_AATREE *)pAVar2;
  }
  return value;
}

Assistant:

static ALLEGRO_CONFIG_SECTION *config_add_section(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *name)
{
   ALLEGRO_CONFIG_SECTION *sec = config->head;
   ALLEGRO_CONFIG_SECTION *section;

   if ((section = find_section(config, name)))
      return section;

   section = al_calloc(1, sizeof(ALLEGRO_CONFIG_SECTION));
   section->name = al_ustr_dup(name);

   if (sec == NULL) {
      config->head = section;
      config->last = section;
   }
   else {
      ASSERT(config->last->next == NULL);
      config->last->next = section;
      section->prev = config->last;
      config->last = section;
   }

   config->tree = _al_aa_insert(config->tree, section->name, section, cmp_ustr);

   return section;
}